

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O1

BinaryOperatorTypes *
soul::TypeRules::getTypesForLogicalOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  Category CVar1;
  uint uVar2;
  uint uVar3;
  
  CVar1 = a->category;
  uVar2 = (uint)CVar1;
  if (((7 < CVar1) || ((200U >> (CVar1 & 0x1f) & 1) == 0)) &&
     ((7 < b->category || ((200U >> (b->category & 0x1f) & 1) == 0)))) {
    if (CVar1 != primitive) {
      if (CVar1 != vector) goto LAB_001ddfb0;
      uVar2 = a->boundingSize;
    }
    CVar1 = b->category;
    uVar3 = (uint)CVar1;
    if (CVar1 != primitive) {
      if (CVar1 != vector) {
LAB_001ddfb0:
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      uVar3 = b->boundingSize;
    }
    if (uVar2 == uVar3) {
      (__return_storage_ptr__->resultType).category = primitive;
      (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
      (__return_storage_ptr__->resultType).isRef = false;
      (__return_storage_ptr__->resultType).isConstant = false;
      (__return_storage_ptr__->resultType).primitiveType = bool_;
      (__return_storage_ptr__->resultType).boundingSize = 0;
      (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
      (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
      (__return_storage_ptr__->operandType).category = primitive;
      (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
      (__return_storage_ptr__->operandType).isRef = false;
      (__return_storage_ptr__->operandType).isConstant = false;
      (__return_storage_ptr__->operandType).primitiveType = bool_;
      (__return_storage_ptr__->operandType).boundingSize = 0;
      (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
      (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->operandType).boundingSize = 0;
  (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->operandType).category = invalid;
  (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
  (__return_storage_ptr__->operandType).isRef = false;
  (__return_storage_ptr__->operandType).isConstant = false;
  (__return_storage_ptr__->operandType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).category = invalid;
  (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
  (__return_storage_ptr__->resultType).isRef = false;
  (__return_storage_ptr__->resultType).isConstant = false;
  (__return_storage_ptr__->resultType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).boundingSize = 0;
  (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForLogicalOp (const Type& a, const Type& b)
    {
        if (areTypesSuitableForBinaryOp (a, b) && a.getVectorSize() == b.getVectorSize())
            return { PrimitiveType::bool_, PrimitiveType::bool_ };

        return {};
    }